

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O1

string * __thiscall
flatbuffers::java::JavaGenerator::SourceCast_abi_cxx11_
          (string *__return_storage_ptr__,JavaGenerator *this,Type *type,bool castFromDest)

{
  BaseType BVar1;
  char *pcVar2;
  char *pcVar3;
  Type local_28;
  
  BVar1 = type->base_type;
  if ((BVar1 < (BASE_TYPE_VECTOR64|BASE_TYPE_UTYPE)) &&
     ((0x64000U >> (BVar1 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) != 0)) {
    local_28.base_type = type->element;
    local_28.struct_def = type->struct_def;
    local_28.enum_def = type->enum_def;
    local_28.fixed_length = type->fixed_length;
    local_28.element = BASE_TYPE_NONE;
    SourceCast_abi_cxx11_(__return_storage_ptr__,this,&local_28,castFromDest);
    return __return_storage_ptr__;
  }
  if (castFromDest) {
    if (BVar1 == BASE_TYPE_UCHAR) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "(byte) ";
      pcVar2 = "";
      goto LAB_0023acc2;
    }
    if (BVar1 == BASE_TYPE_USHORT) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "(short) ";
      pcVar2 = "";
      goto LAB_0023acc2;
    }
    if (BVar1 == BASE_TYPE_UINT) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "(int) ";
      pcVar2 = "";
      goto LAB_0023acc2;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = "";
  pcVar3 = "";
LAB_0023acc2:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string SourceCast(const Type &type, bool castFromDest) const {
    if (IsSeries(type)) {
      return SourceCast(type.VectorType(), castFromDest);
    } else {
      if (castFromDest) {
        if (type.base_type == BASE_TYPE_UINT)
          return "(int) ";
        else if (type.base_type == BASE_TYPE_USHORT)
          return "(short) ";
        else if (type.base_type == BASE_TYPE_UCHAR)
          return "(byte) ";
      }
    }
    return "";
  }